

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O0

void __thiscall FRandom::FRandom(FRandom *this,char *name)

{
  DWORD DVar1;
  size_t sVar2;
  bool bVar3;
  FRandom *local_28;
  FRandom *probe;
  FRandom **prev;
  char *name_local;
  FRandom *this_local;
  
  sVar2 = strlen(name);
  DVar1 = CalcCRC32((BYTE *)name,(uint)sVar2);
  this->NameCRC = DVar1;
  this->initialized = false;
  this->Name = name;
  if (this->NameCRC == 0) {
    __assert_fail("NameCRC != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/m_random.cpp"
                  ,0xb2,"FRandom::FRandom(const char *)");
  }
  probe = (FRandom *)&RNGList;
  local_28 = RNGList;
  while( true ) {
    bVar3 = false;
    if (local_28 != (FRandom *)0x0) {
      bVar3 = local_28->NameCRC < this->NameCRC;
    }
    if (!bVar3) break;
    probe = (FRandom *)&local_28->Next;
    local_28 = local_28->Next;
  }
  if ((local_28 != (FRandom *)0x0) && (local_28->NameCRC == this->NameCRC)) {
    __assert_fail("probe->NameCRC != NameCRC",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/m_random.cpp"
                  ,0xc4,"FRandom::FRandom(const char *)");
  }
  this->Next = local_28;
  probe->Name = (char *)this;
  return;
}

Assistant:

FRandom::FRandom (const char *name)
{
	NameCRC = CalcCRC32 ((const BYTE *)name, (unsigned int)strlen (name));
#ifndef NDEBUG
	initialized = false;
	Name = name;
	// A CRC of 0 is reserved for nameless RNGs that don't get stored
	// in savegames. The chance is very low that you would get a CRC of 0,
	// but it's still possible.
	assert (NameCRC != 0);
#endif

	// Insert the RNG in the list, sorted by CRC
	FRandom **prev = &RNGList, *probe = RNGList;

	while (probe != NULL && probe->NameCRC < NameCRC)
	{
		prev = &probe->Next;
		probe = probe->Next;
	}

#ifndef NDEBUG
	if (probe != NULL)
	{
		// Because RNGs are identified by their CRCs in save games,
		// no two RNGs can have names that hash to the same CRC.
		// Obviously, this means every RNG must have a unique name.
		assert (probe->NameCRC != NameCRC);
	}
#endif

	Next = probe;
	*prev = this;
}